

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main(void)

{
  undefined *puVar1;
  uchar *buffer;
  cs_err cVar2;
  size_t count;
  long lVar3;
  size_t sVar4;
  int i;
  long lVar5;
  cs_insn *insn;
  csh handle;
  cs_insn *local_40;
  csh local_38;
  
  lVar5 = 0;
  do {
    puts("****************");
    puVar1 = (&PTR_anon_var_dwarf_45_0025caa8)[lVar5 * 5];
    printf("Platform: %s\n",puVar1);
    cVar2 = cs_open((&DAT_0025ca90)[lVar5 * 10],(&DAT_0025ca94)[lVar5 * 10],&local_38);
    if (cVar2 == CS_ERR_OK) {
      if ((&DAT_0025cab0)[lVar5 * 10] != 0) {
        cs_option(local_38,(&DAT_0025cab0)[lVar5 * 10],(ulong)(uint)(&DAT_0025cab4)[lVar5 * 10]);
      }
      buffer = (&PTR_anon_var_dwarf_27_0025ca98)[lVar5 * 5];
      sVar4 = (&DAT_0025caa0)[lVar5 * 5];
      count = cs_disasm(local_38,buffer,sVar4,0x1000,0,&local_40);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",puVar1);
        print_string_hex(buffer,sVar4);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        print_string_hex(buffer,sVar4);
        puts("Disasm:");
        lVar3 = 0x22;
        sVar4 = count;
        do {
          printf("0x%lx:\t%s\t\t%s\n",*(undefined8 *)(local_40->bytes + lVar3 + -0x2c),
                 local_40->bytes + lVar3 + -0x12);
          lVar3 = lVar3 + 0xf0;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
        printf("0x%lx:\n",(ulong)local_40[count - 1].size + local_40[count - 1].address);
        cs_free(local_40,count);
      }
      putchar(10);
      cs_close(&local_38);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar2);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x15);
  return 0;
}

Assistant:

int main()
{
	test();

#if 0
#define offsetof(st, m) __builtin_offsetof(st, m)

	cs_insn insn;
	printf("size: %lu\n", sizeof(insn));
	printf("@id: %lu\n", offsetof(cs_insn, id));
	printf("@address: %lu\n", offsetof(cs_insn, address));
	printf("@size: %lu\n", offsetof(cs_insn, size));
	printf("@bytes: %lu\n", offsetof(cs_insn, bytes));
	printf("@mnemonic: %lu\n", offsetof(cs_insn, mnemonic));
	printf("@op_str: %lu\n", offsetof(cs_insn, op_str));
	printf("@regs_read: %lu\n", offsetof(cs_insn, regs_read));
	printf("@regs_read_count: %lu\n", offsetof(cs_insn, regs_read_count));
	printf("@regs_write: %lu\n", offsetof(cs_insn, regs_write));
	printf("@regs_write_count: %lu\n", offsetof(cs_insn, regs_write_count));
	printf("@groups: %lu\n", offsetof(cs_insn, groups));
	printf("@groups_count: %lu\n", offsetof(cs_insn, groups_count));
	printf("@arch: %lu\n", offsetof(cs_insn, x86));
#endif

	return 0;
}